

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph.h
# Opt level: O0

WeightedDigraph<int,_int> * __thiscall
data_structures::WeightedDigraph<int,_int>::addEdge
          (WeightedDigraph<int,_int> *this,int *v,int *w,int weight)

{
  bool bVar1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *wp;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *vp;
  int weight_local;
  int *w_local;
  int *v_local;
  WeightedDigraph<int,_int> *this_local;
  
  if (*v != *w) {
    pRVar2 = RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode
                       (&(this->super_WeightedGraph<int,_int>)._tree,v);
    node = RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode
                     (&(this->super_WeightedGraph<int,_int>)._tree,w);
    bVar1 = WeightedGraphAdjSet<int,_int>::addEdge(&(pRVar2->element).value,node,weight);
    if (bVar1) {
      (this->super_WeightedGraph<int,_int>)._edge_count =
           (this->super_WeightedGraph<int,_int>)._edge_count + 1;
    }
  }
  return this;
}

Assistant:

inline
    WeightedDigraph<T, Weight>& WeightedDigraph<T, Weight>::addEdge(const T& v, const T& w, Weight weight){
        if (v == w) {
            return *this;
        }
        auto vp = this->_tree.getNode(v);
        auto wp = this->_tree.getNode(w);
        if (vp->element.value.addEdge(wp, weight)) {
            this->_edge_count++;
        }
        return *this;
    }